

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O3

int fits_get_token2(char **ptr,char *delimiter,char **token,int *isanumber,int *status)

{
  char cVar1;
  size_t sVar2;
  char *pcVar3;
  int *piVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  char *loc;
  char tval [73];
  byte *local_90;
  char local_88 [72];
  undefined1 local_40;
  
  iVar6 = 0;
  if (*status == 0) {
    pcVar7 = *ptr;
    cVar1 = *pcVar7;
    while (cVar1 == ' ') {
      pcVar7 = pcVar7 + 1;
      *ptr = pcVar7;
      cVar1 = *pcVar7;
    }
    sVar2 = strcspn(pcVar7,delimiter);
    iVar5 = (int)sVar2;
    iVar6 = 0;
    if (iVar5 != 0) {
      pcVar7 = (char *)calloc((long)((sVar2 << 0x20) + 0x100000000) >> 0x20,1);
      *token = pcVar7;
      if (pcVar7 == (char *)0x0) {
        ffpmsg("Couldn\'t allocate memory to hold token string (fits_get_token2).");
        *status = 0x71;
      }
      else {
        pcVar3 = *ptr;
        sVar2 = (long)(sVar2 << 0x20) >> 0x20;
        strncat(pcVar7,pcVar3,sVar2);
        *ptr = pcVar3 + sVar2;
        iVar6 = iVar5;
        if (isanumber != (int *)0x0) {
          *isanumber = 1;
          pcVar7 = *token;
          pcVar3 = strchr(pcVar7,0x44);
          if (pcVar3 != (char *)0x0) {
            strncpy(local_88,pcVar7,0x48);
            local_40 = 0;
            local_90 = (byte *)strchr(local_88,0x44);
            if (local_90 != (byte *)0x0) {
              *local_90 = 0x45;
            }
            pcVar7 = local_88;
          }
          strtod(pcVar7,(char **)&local_90);
          if ((*local_90 & 0xdf) != 0) {
            *isanumber = 0;
          }
          piVar4 = __errno_location();
          if (*piVar4 == 0x22) {
            *isanumber = 0;
          }
        }
      }
    }
  }
  return iVar6;
}

Assistant:

int fits_get_token2(char **ptr, 
                   char *delimiter,
                   char **token,
                   int *isanumber,  /* O - is this token a number? */
		   int *status)

/*
   parse off the next token, delimited by a character in 'delimiter',
   from the input ptr string;  increment *ptr to the end of the token.
   Returns the length of the token, not including the delimiter char;

   This routine allocates the *token string;  the calling routine must free it 
*/
{
    char *loc, tval[73];
    int slen;
    double dval;
    
    if (*status)
        return(0);
	
    while (**ptr == ' ')  /* skip over leading blanks */
        (*ptr)++;

    slen = strcspn(*ptr, delimiter);  /* length of next token */
    if (slen)
    {
	*token = (char *) calloc(slen + 1, 1); 
	if (!(*token)) {
          ffpmsg("Couldn't allocate memory to hold token string (fits_get_token2).");
          *status = MEMORY_ALLOCATION ;
	  return(0);
        }
 
        strncat(*token, *ptr, slen);       /* copy token */
        (*ptr) += slen;                   /* skip over the token */

        if (isanumber)  /* check if token is a number */
        {
            *isanumber = 1;

	    if (strchr(*token, 'D'))  {
	        strncpy(tval, *token, 72);
		tval[72] = '\0';

	        /*  The C language does not support a 'D'; replace with 'E' */
	        if ((loc = strchr(tval, 'D'))) *loc = 'E';

	        dval =  strtod(tval, &loc);
	    } else {
	        dval =  strtod(*token, &loc);
 	    }

	    /* check for read error, or junk following the value */
	    if (*loc != '\0' && *loc != ' ' ) *isanumber = 0;
	    if (errno == ERANGE) *isanumber = 0;
        }
    }

    return(slen);
}